

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

TexDictionary * rw::TexDictionary::streamRead(Stream *stream)

{
  FILE *pFVar1;
  bool bVar2;
  ushort uVar3;
  Error in_RAX;
  TexDictionary *this;
  Texture *t;
  char *pcVar4;
  uint uVar5;
  Error _e;
  
  _e = in_RAX;
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    uVar3 = Stream::readI16(stream);
    Stream::readI16(stream);
    this = create();
    if (this != (TexDictionary *)0x0) {
      uVar5 = 0;
      if (0 < (short)uVar3) {
        uVar5 = (uint)uVar3;
      }
      while (uVar5 != 0) {
        bVar2 = findChunk(stream,0x15,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          _e.plugin = 0;
          _e.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
                  ,0xc4);
          pFVar1 = _stderr;
          pcVar4 = dbgsprint(0x80000004,"TEXTURENATIVE");
          fprintf(pFVar1,"%s\n",pcVar4);
          setError(&_e);
          goto LAB_0010d9fe;
        }
        t = Texture::streamReadNative(stream);
        if (t == (Texture *)0x0) goto LAB_0010d9fe;
        PluginList::streamRead((PluginList *)&Texture::s_plglist,stream,t);
        add(this,t);
        uVar5 = uVar5 - 1;
      }
      bVar2 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
      if (bVar2) {
        return this;
      }
LAB_0010d9fe:
      destroy(this);
    }
  }
  else {
    _e.plugin = 0;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
            ,0xb7);
    pFVar1 = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar4);
    setError(&_e);
  }
  return (TexDictionary *)0x0;
}

Assistant:

TexDictionary*
TexDictionary::streamRead(Stream *stream)
{
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	int32 numTex = stream->readI16();
	stream->readI16(); // device id (0 = unknown, 1 = d3d8, 2 = d3d9,
	                   // 3 = gcn, 4 = null, 5 = opengl,
	                   // 6 = ps2, 7 = softras, 8 = xbox, 9 = psp)
	TexDictionary *txd = TexDictionary::create();
	if(txd == nil)
		return nil;
	Texture *tex;
	for(int32 i = 0; i < numTex; i++){
		if(!findChunk(stream, ID_TEXTURENATIVE, nil, nil)){
			RWERROR((ERR_CHUNK, "TEXTURENATIVE"));
			goto fail;
		}
		tex = Texture::streamReadNative(stream);
		if(tex == nil)
			goto fail;
		Texture::s_plglist.streamRead(stream, tex);
		txd->add(tex);
	}
	if(s_plglist.streamRead(stream, txd))
		return txd;
fail:
	txd->destroy();
	return nil;
}